

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

QMetaCallEvent *
QMetaCallEvent::create_impl
          (SlotObjUniquePtr slotObj,QObject *sender,int signal_index,size_t argc,void **argp,
          QMetaType *metaTypes)

{
  int iVar1;
  QMetaCallEvent *this;
  void *pvVar2;
  void **ppvVar3;
  long lVar4;
  long in_FS_OFFSET;
  QSlotObjectBase *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QMetaCallEvent *)operator_new(0x78);
  local_40 = *(QSlotObjectBase **)
              slotObj._M_t.
              super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
              .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
  *(undefined8 *)
   slotObj._M_t.
   super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
   super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
   super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl = 0;
  QMetaCallEvent(this,(SlotObjUniquePtr)&local_40,sender,signal_index,(int)argc);
  if (local_40 != (QSlotObjectBase *)0x0) {
    QtPrivate::QSlotObjectBase::Deleter::operator()((Deleter *)&local_40,local_40);
  }
  if (argc != 0) {
    ppvVar3 = (this->d).args_;
    iVar1 = (this->d).nargs_;
    lVar4 = 0;
    do {
      ppvVar3[iVar1] = metaTypes->d_ptr;
      pvVar2 = QMetaType::create((QMetaType *)(ppvVar3 + iVar1),*argp);
      *ppvVar3 = pvVar2;
      if ((lVar4 != 0) && (pvVar2 == (void *)0x0)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          qBadAlloc();
        }
        goto LAB_002af35a;
      }
      lVar4 = lVar4 + -1;
      ppvVar3 = ppvVar3 + 1;
      argp = argp + 1;
      metaTypes = metaTypes + 1;
    } while (-lVar4 != argc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
LAB_002af35a:
  __stack_chk_fail();
}

Assistant:

QMetaCallEvent* QMetaCallEvent::create_impl(QtPrivate::SlotObjUniquePtr slotObj,
                                            const QObject *sender, int signal_index,
                                            size_t argc, const void* const argp[],
                                            const QMetaType metaTypes[])
{
    auto metaCallEvent = std::make_unique<QMetaCallEvent>(std::move(slotObj), sender,
                                                          signal_index, int(argc));

    void **args = metaCallEvent->args();
    QMetaType *types = metaCallEvent->types();
    for (size_t i = 0; i < argc; ++i) {
        types[i] = metaTypes[i];
        args[i] = types[i].create(argp[i]);
        Q_CHECK_PTR(!i || args[i]);
    }

    return metaCallEvent.release();
}